

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O1

parser_error parse_player_timed_fail(parser *p)

{
  uint uVar1;
  errr eVar2;
  int iVar3;
  ulong in_RAX;
  long *plVar4;
  char *what;
  undefined8 *puVar5;
  parser_error pVar6;
  char *__s1;
  char **flag_table;
  long lVar7;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  plVar4 = (long *)parser_priv(p);
  what = parser_getstr(p,"flag");
  if (plVar4 == (long *)0x0) {
    __assert_fail("ps",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-timed.c"
                  ,0xbd,"enum parser_error parse_player_timed_fail(struct parser *)");
  }
  if (*plVar4 == 0) {
    return PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  uVar1 = parser_getuint(p,"code");
  pVar6 = PARSE_ERROR_INVALID_FLAG;
  switch(uVar1) {
  case 1:
    flag_table = list_obj_flag_names;
    goto LAB_001c08fb;
  case 2:
  case 3:
    uStack_38 = uStack_38 & 0xffffffff;
    if (list_element_names[0] != (char *)0x0) {
      lVar7 = 1;
      __s1 = list_element_names[0];
      do {
        iVar3 = strcmp(__s1,what);
        if (iVar3 == 0) break;
        uStack_38 = CONCAT44((int)lVar7,(undefined4)uStack_38);
        __s1 = list_element_names[lVar7];
        lVar7 = lVar7 + 1;
      } while (__s1 != (char *)0x0);
      if ((int)lVar7 == 0x1d) {
        return PARSE_ERROR_INVALID_FLAG;
      }
    }
    break;
  case 4:
    flag_table = list_player_flag_names;
LAB_001c08fb:
    iVar3 = lookup_flag(flag_table,what);
    uStack_38 = CONCAT44(iVar3,(undefined4)uStack_38);
    if (iVar3 == 0) {
      return PARSE_ERROR_INVALID_FLAG;
    }
    break;
  case 5:
    eVar2 = grab_name("timed effect",what,list_timed_effect_names,0x36,(int *)((long)&uStack_38 + 4)
                     );
    if (eVar2 != 0) {
      return PARSE_ERROR_INVALID_FLAG;
    }
    break;
  default:
    goto switchD_001c0875_default;
  }
  puVar5 = (undefined8 *)mem_alloc(0x10);
  lVar7 = *plVar4;
  *puVar5 = *(undefined8 *)(lVar7 + 0x38);
  *(uint *)(puVar5 + 1) = uVar1;
  *(undefined4 *)((long)puVar5 + 0xc) = uStack_38._4_4_;
  *(undefined8 **)(lVar7 + 0x38) = puVar5;
  pVar6 = PARSE_ERROR_NONE;
switchD_001c0875_default:
  return pVar6;
}

Assistant:

static enum parser_error parse_player_timed_fail(struct parser *p)
{
	struct timed_effect_parse_state *ps =
		(struct timed_effect_parse_state*) parser_priv(p);
	const char *name = parser_getstr(p, "flag");
	struct timed_failure *f;
	int code, idx;

	assert(ps);
	if (!ps->t) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}

	code = parser_getuint(p, "code");
	switch (code) {
	case TMD_FAIL_FLAG_OBJECT:
		idx = lookup_flag(list_obj_flag_names, name);
		if (idx == FLAG_END) {
			return PARSE_ERROR_INVALID_FLAG;
		}
		break;

	case TMD_FAIL_FLAG_PLAYER:
		idx = lookup_flag(list_player_flag_names, name);
		if (idx == FLAG_END) {
			return PARSE_ERROR_INVALID_FLAG;
		}
		break;

	case TMD_FAIL_FLAG_RESIST:
	case TMD_FAIL_FLAG_VULN:
		idx = 0;
		while (list_element_names[idx]
				&& !streq(list_element_names[idx], name)) {
			idx++;
		}
		if (idx == ELEM_MAX) {
			return PARSE_ERROR_INVALID_FLAG;
		}
		break;

	case TMD_FAIL_FLAG_TIMED_EFFECT:
		if (grab_name("timed effect", name,
				list_timed_effect_names,
				N_ELEMENTS(list_timed_effect_names),
				&idx)) {
			return PARSE_ERROR_INVALID_FLAG;
		}
		break;

	default:
		return PARSE_ERROR_INVALID_FLAG;
	}

	f = mem_alloc(sizeof(*f));
	f->next = ps->t->fail;
	f->code = code;
	f->idx = idx;
	ps->t->fail = f;

	return PARSE_ERROR_NONE;
}